

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha1_Transform(sha2_word32 *state_in,sha2_word32 *data,sha2_word32 *state_out)

{
  sha2_word32 sVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  sha2_word32 sVar8;
  sha2_word32 sVar9;
  uint uVar10;
  sha2_word32 sVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  sha2_word32 W1 [16];
  
  sVar1 = *state_in;
  W1._8_8_ = *(undefined8 *)(data + 0xc);
  W1._16_8_ = *(undefined8 *)(data + 0xe);
  uStack_48 = *(undefined8 *)(data + 8);
  W1._0_8_ = *(undefined8 *)(data + 10);
  local_58 = *(undefined8 *)(data + 4);
  uStack_50 = *(undefined8 *)(data + 6);
  local_68 = *(undefined8 *)data;
  uStack_60 = *(undefined8 *)(data + 2);
  lVar3 = 0;
  sVar9 = state_in[1];
  sVar8 = state_in[2];
  uVar7 = state_in[3];
  uVar5 = state_in[4];
  sVar11 = sVar1;
  do {
    uVar4 = sVar11;
    uVar10 = uVar7;
    uVar7 = sVar8;
    sVar11 = data[lVar3] +
             ((uVar7 ^ uVar10) & sVar9 ^ uVar10) + (uVar4 << 5 | uVar4 >> 0x1b) + uVar5 + 0x5a827999
    ;
    sVar8 = sVar9 << 0x1e | sVar9 >> 2;
    lVar3 = lVar3 + 1;
    sVar9 = uVar4;
    uVar5 = uVar10;
  } while (lVar3 != 0x10);
  uVar6 = 0;
  do {
    uVar5 = sVar11;
    uVar2 = uVar7;
    uVar7 = sVar8;
    uVar12 = *(uint *)((long)&local_68 + (uVar6 ^ 8) * 4) ^
             *(uint *)((long)&local_68 + (ulong)((int)uVar6 + 0x1dU & 0xf) * 4) ^
             *(uint *)((long)&uStack_60 + uVar6 * 4) ^ *(uint *)((long)&local_68 + uVar6 * 4);
    uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    *(uint *)((long)&local_68 + uVar6 * 4) = uVar12;
    sVar11 = uVar12 + ((uVar7 ^ uVar2) & uVar4 ^ uVar2) + (uVar5 << 5 | uVar5 >> 0x1b) + uVar10 +
             0x5a827999;
    sVar8 = uVar4 << 0x1e | uVar4 >> 2;
    uVar6 = uVar6 + 1;
    uVar4 = uVar5;
    uVar10 = uVar2;
  } while (uVar6 != 4);
  uVar4 = 0x14;
  do {
    uVar10 = sVar11;
    uVar12 = uVar7;
    uVar7 = sVar8;
    uVar13 = uVar4 & 0xf;
    uVar14 = *(uint *)((long)&local_68 + (ulong)(uVar13 ^ 8) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar4 + 0xd & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar4 + 2 & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)uVar13 * 4);
    uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    *(uint *)((long)&local_68 + (ulong)uVar13 * 4) = uVar14;
    sVar11 = uVar14 + (uVar7 ^ uVar5 ^ uVar12) + (uVar10 << 5 | uVar10 >> 0x1b) + uVar2 + 0x6ed9eba1
    ;
    sVar8 = uVar5 << 0x1e | uVar5 >> 2;
    uVar4 = uVar4 + 1;
    uVar5 = uVar10;
    uVar2 = uVar12;
  } while (uVar4 != 0x28);
  uVar5 = 0x28;
  do {
    uVar4 = sVar11;
    uVar2 = uVar7;
    uVar7 = sVar8;
    uVar13 = uVar5 & 0xf;
    uVar14 = *(uint *)((long)&local_68 + (ulong)(uVar13 ^ 8) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar5 + 0xd & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar5 + 2 & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)uVar13 * 4);
    uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    *(uint *)((long)&local_68 + (ulong)uVar13 * 4) = uVar14;
    sVar11 = uVar14 + (uVar2 & uVar7 ^ (uVar2 ^ uVar7) & uVar10) +
                      (uVar4 << 5 | uVar4 >> 0x1b) + uVar12 + 0x8f1bbcdc;
    sVar8 = uVar10 << 0x1e | uVar10 >> 2;
    uVar5 = uVar5 + 1;
    uVar10 = uVar4;
    uVar12 = uVar2;
  } while (uVar5 != 0x3c);
  uVar5 = 0x3c;
  do {
    uVar12 = sVar11;
    uVar10 = uVar7;
    uVar7 = sVar8;
    uVar13 = uVar5 & 0xf;
    uVar14 = *(uint *)((long)&local_68 + (ulong)(uVar13 ^ 8) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar5 + 0xd & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)(uVar5 + 2 & 0xf) * 4) ^
             *(uint *)((long)&local_68 + (ulong)uVar13 * 4);
    uVar14 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    *(uint *)((long)&local_68 + (ulong)uVar13 * 4) = uVar14;
    sVar11 = uVar14 + (uVar7 ^ uVar4 ^ uVar10) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar2 + 0xca62c1d6
    ;
    sVar8 = uVar4 << 0x1e | uVar4 >> 2;
    uVar5 = uVar5 + 1;
    uVar4 = uVar12;
    uVar2 = uVar10;
  } while (uVar5 != 0x50);
  *state_out = sVar11 + sVar1;
  state_out[1] = uVar12 + state_in[1];
  state_out[2] = sVar8 + state_in[2];
  state_out[3] = uVar7 + state_in[3];
  state_out[4] = uVar10 + state_in[4];
  return;
}

Assistant:

void sha1_Transform(const sha2_word32* state_in, const sha2_word32* data, sha2_word32* state_out) {
	sha2_word32	a, b, c, d, e;
	sha2_word32	T1;
	sha2_word32	W1[16];
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = state_in[0];
	b = state_in[1];
	c = state_in[2];
	d = state_in[3];
	e = state_in[4];
	j = 0;
	do {
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + (W1[j] = *data++);
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 16);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Ch(b,c,d) + e + K1_0_TO_19 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 20);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_20_TO_39 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 40);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Maj(b,c,d) + e + K1_40_TO_59 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 60);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_60_TO_79 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 80);


	/* Compute the current intermediate hash value */
	state_out[0] = state_in[0] + a;
	state_out[1] = state_in[1] + b;
	state_out[2] = state_in[2] + c;
	state_out[3] = state_in[3] + d;
	state_out[4] = state_in[4] + e;
}